

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

point3d * tinyusdz::geometric_normal
                    (point3d *__return_storage_ptr__,point3d *p0,point3d *p1,point3d *p2)

{
  point3d local_68;
  point3d local_50;
  undefined1 local_38 [8];
  point3d n;
  point3d *p2_local;
  point3d *p1_local;
  point3d *p0_local;
  
  n.z = (double)p2;
  operator-(&local_50,p1,p0);
  operator-(&local_68,(point3d *)n.z,p0);
  vcross((point3d *)local_38,&local_50,&local_68);
  vnormalize(__return_storage_ptr__,(point3d *)local_38,2.220446049250313e-16);
  return __return_storage_ptr__;
}

Assistant:

value::point3d geometric_normal(const value::point3d &p0, const value::point3d &p1, const value::point3d &p2)
{
  value::point3d n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}